

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

Block * __thiscall
Js::CompoundString::BlockInfo::CopyBuffer
          (BlockInfo *this,void *buffer,CharCount usedCharLength,bool reserveMoreSpace,
          Recycler *recycler)

{
  char *addr;
  WriteBarrierPtr<void> *address;
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  CharCount count;
  undefined4 *puVar4;
  Block *block;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x178,"(buffer)","buffer");
    if (!bVar2) goto LAB_00a07797;
    *puVar4 = 0;
  }
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x179,"(recycler)","recycler");
    if (!bVar2) {
LAB_00a07797:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  CVar3 = AlignCharCapacityForAllocation(usedCharLength);
  if (reserveMoreSpace) {
    CVar3 = GrowCharCapacity(CVar3);
  }
  bVar2 = ShouldAllocateBuffer(CVar3);
  if (bVar2) {
    AllocateBuffer(this,CVar3,recycler);
    this->charLength = usedCharLength;
    addr = (char *)(this->buffer).ptr;
    count = Block::PointerLengthFromCharLength(CVar3);
    Memory::Recycler::WBSetBitRange(addr,count);
    js_wmemcpy_s((char16 *)(this->buffer).ptr,(ulong)CVar3,(char16 *)buffer,(ulong)usedCharLength);
    address = (WriteBarrierPtr<void> *)(this->buffer).ptr;
    CVar3 = PointerLength(this);
    Memory::_ArrayWriteBarrier<Memory::_write_barrier_policy>::
    WriteBarrier<Memory::WriteBarrierPtr<void>>(address,(ulong)CVar3);
    block = (Block *)0x0;
  }
  else {
    block = Block::New(buffer,usedCharLength,reserveMoreSpace,recycler);
    CopyFrom(this,block);
  }
  return block;
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::CopyBuffer(
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        Recycler *const recycler)
    {
        Assert(buffer);
        Assert(recycler);

        CharCount charCapacity = AlignCharCapacityForAllocation(usedCharLength);
        if(reserveMoreSpace)
            charCapacity = GrowCharCapacity(charCapacity);
        if(ShouldAllocateBuffer(charCapacity))
        {
            AllocateBuffer(charCapacity, recycler);
            charLength = usedCharLength;

            ArrayWriteBarrierVerifyBits(Block::Pointers(Chars()), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s(Chars(), charCapacity, (const char16*)(buffer), usedCharLength);
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, usedCharLength, reserveMoreSpace, recycler);
        CopyFrom(block);
        return block;
    }